

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

string * __thiscall
RegressionTree::dynamicFunctionsGenerator_abi_cxx11_
          (string *__return_storage_ptr__,RegressionTree *this)

{
  size_t sVar1;
  Attribute *pAVar2;
  TDNode *pTVar3;
  ulong uVar4;
  long lVar5;
  ulong attID;
  ulong local_cc8;
  string evalFunction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  string findPredSwitch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  string findPrediction;
  string loadFunction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  string testTuple;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  string attrConstruct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  string attributeString;
  string genDynFuncs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string varTypeList;
  string conditionsString;
  string headerFiles;
  string relationName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  string relationMap;
  string varList;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string condition [2];
  
  std::__cxx11::string::string((string *)condition," <= ",(allocator *)&varList);
  std::__cxx11::string::string((string *)(condition + 1)," == ",(allocator *)&relationMap);
  std::__cxx11::string::string((string *)&varList,"",(allocator *)&relationMap);
  std::__cxx11::string::string((string *)&relationMap,"",(allocator *)&relationName);
  uVar4 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar4) break;
    pAVar2 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar4);
    std::__cxx11::string::string((string *)&relationName,(string *)&pAVar2->_name);
    std::operator+(&conditionsString,"\"",&relationName);
    std::operator+(&varTypeList,&conditionsString,"\",");
    std::__cxx11::string::append((string *)&varList);
    std::__cxx11::string::~string((string *)&varTypeList);
    std::__cxx11::string::~string((string *)&conditionsString);
    std::__cxx11::to_string(&conditionsString,this->_queryRootIndex[uVar4]);
    std::operator+(&varTypeList,&conditionsString,",");
    std::__cxx11::string::append((string *)&relationMap);
    std::__cxx11::string::~string((string *)&varTypeList);
    std::__cxx11::string::~string((string *)&conditionsString);
    std::__cxx11::string::~string((string *)&relationName);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::__cxx11::string::string((string *)&relationName,"",(allocator *)&varTypeList);
  std::__cxx11::string::string((string *)&varTypeList,"",(allocator *)&conditionsString);
  std::__cxx11::string::string((string *)&conditionsString,"",(allocator *)&headerFiles);
  uVar4 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar4) break;
    pTVar3 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar4);
    std::operator+(&genDynFuncs,"\"",&pTVar3->_name);
    std::operator+(&headerFiles,&genDynFuncs,"\",");
    std::__cxx11::string::append((string *)&relationName);
    std::__cxx11::string::~string((string *)&headerFiles);
    std::__cxx11::string::~string((string *)&genDynFuncs);
    std::__cxx11::string::append((char *)&conditionsString);
    std::__cxx11::string::append((char *)&varTypeList);
    pTVar3 = TreeDecomposition::getRelation
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar4);
    for (attID = 0; attID != 100; attID = attID + 1) {
      if (((pTVar3->_bag).super__Base_bitset<2UL>._M_w[attID >> 6] >> (attID & 0x3f) & 1) != 0) {
        pAVar2 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,attID);
        Application::typeToStr_abi_cxx11_(&attrConstruct,&this->super_Application,pAVar2->_type);
        std::operator+(&attributeString,&attrConstruct," ");
        std::operator+(&genDynFuncs,&attributeString,&pAVar2->_name);
        std::operator+(&headerFiles,&genDynFuncs,",");
        std::__cxx11::string::append((string *)&varTypeList);
        std::__cxx11::string::~string((string *)&headerFiles);
        std::__cxx11::string::~string((string *)&genDynFuncs);
        std::__cxx11::string::~string((string *)&attributeString);
        std::__cxx11::string::~string((string *)&attrConstruct);
      }
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)&varTypeList);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  Application::offset_abi_cxx11_(&evalFunction,&this->super_Application,0);
  std::operator+(&findPrediction,&evalFunction,"#include <fstream>\n");
  std::operator+(&findPredSwitch,&findPrediction,"#include <vector>\n");
  std::operator+(&loadFunction,&findPredSwitch,"#include \"RegressionTreeNode.hpp\"\n\n");
  std::operator+(&testTuple,&loadFunction,"#include <boost/spirit/include/qi.hpp>\n");
  std::operator+(&attrConstruct,&testTuple,"#include <boost/spirit/include/phoenix_core.hpp>\n");
  std::operator+(&attributeString,&attrConstruct,
                 "#include <boost/spirit/include/phoenix_operator.hpp>\n\n");
  std::operator+(&genDynFuncs,&attributeString,"namespace qi = boost::spirit::qi;\n");
  std::operator+(&headerFiles,&genDynFuncs,"namespace phoenix = boost::phoenix;\n\n");
  std::__cxx11::string::~string((string *)&genDynFuncs);
  std::__cxx11::string::~string((string *)&attributeString);
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&findPredSwitch);
  std::__cxx11::string::~string((string *)&findPrediction);
  std::__cxx11::string::~string((string *)&evalFunction);
  Application::offset_abi_cxx11_(&local_3b8,&this->super_Application,1);
  std::operator+(&local_398,"void generateDynamicFunctions(std::vector<Condition>& conditions)\n{\n"
                 ,&local_3b8);
  std::operator+(&local_378,&local_398,"std::string variableMap[] = {");
  std::operator+(&local_358,&local_378,&varList);
  std::operator+(&local_338,&local_358,"};\n");
  Application::offset_abi_cxx11_(&local_3d8,&this->super_Application,1);
  std::operator+(&local_318,&local_338,&local_3d8);
  std::operator+(&local_2f8,&local_318,"std::string variableList[] = {");
  std::operator+(&local_2d8,&local_2f8,&varTypeList);
  std::operator+(&local_2b8,&local_2d8,"};\n");
  Application::offset_abi_cxx11_(&local_3f8,&this->super_Application,1);
  std::operator+(&local_298,&local_2b8,&local_3f8);
  std::operator+(&local_278,&local_298,"size_t relationMap[] = {");
  std::operator+(&local_258,&local_278,&relationMap);
  std::operator+(&local_238,&local_258,"};\n");
  Application::offset_abi_cxx11_(&local_418,&this->super_Application,1);
  std::operator+(&local_218,&local_238,&local_418);
  std::operator+(&local_1f8,&local_218,"std::string relationName[] = {");
  std::operator+(&local_1d8,&local_1f8,&relationName);
  std::operator+(&local_1b8,&local_1d8,"};\n");
  Application::offset_abi_cxx11_(&local_438,&this->super_Application,1);
  std::operator+(&local_198,&local_1b8,&local_438);
  std::operator+(&local_178,&local_198,"std::string conditionStr[] = {");
  std::operator+(&local_158,&local_178,&conditionsString);
  std::operator+(&local_138,&local_158,"};\n");
  Application::offset_abi_cxx11_(&local_458,&this->super_Application,1);
  std::operator+(&local_118,&local_138,&local_458);
  std::operator+(&local_f8,&local_118,"for (Condition& c : conditions)\n");
  Application::offset_abi_cxx11_(&local_478,&this->super_Application,2);
  std::operator+(&local_d8,&local_f8,&local_478);
  std::operator+(&local_b8,&local_d8,
                 "conditionStr[relationMap[c.variable]] += variableMap[c.variable] + ");
  std::operator+(&local_98,&local_b8,"c.op + std::to_string(c.threshold) + \"&&\";\n");
  Application::offset_abi_cxx11_(&local_498,&this->super_Application,1);
  std::operator+(&local_738,&local_98,&local_498);
  std::operator+(&local_718,&local_738,"std::ofstream ofs(\"DynamicFunctions.cpp\", ");
  std::operator+(&local_7e0,&local_718,"std::ofstream::out);\n");
  Application::offset_abi_cxx11_(&local_4b8,&this->super_Application,1);
  std::operator+(&local_b20,&local_7e0,&local_4b8);
  std::operator+(&local_b00,&local_b20,"ofs << \"#include \\\"DynamicFunctions.h\\\"\\n");
  std::operator+(&local_ae0,&local_b00,"namespace lmfao\\n{\\n\";\n");
  Application::offset_abi_cxx11_(&local_4d8,&this->super_Application,1);
  std::operator+(&local_ac0,&local_ae0,&local_4d8);
  std::operator+(&local_aa0,&local_ac0,"for (size_t rel = 0; rel < ");
  sVar1 = TreeDecomposition::numberOfRelations
                    ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  std::__cxx11::to_string(&local_4f8,sVar1);
  std::operator+(&local_a80,&local_aa0,&local_4f8);
  std::operator+(&local_a60,&local_a80,"; ++rel)\n");
  Application::offset_abi_cxx11_(&local_518,&this->super_Application,1);
  std::operator+(&local_a40,&local_a60,&local_518);
  std::operator+(&local_a20,&local_a40,"{\n");
  Application::offset_abi_cxx11_(&local_538,&this->super_Application,2);
  std::operator+(&local_a00,&local_a20,&local_538);
  std::operator+(&local_9e0,&local_a00,"if (!conditionStr[rel].empty())\n");
  Application::offset_abi_cxx11_(&local_558,&this->super_Application,2);
  std::operator+(&local_9c0,&local_9e0,&local_558);
  std::operator+(&local_9a0,&local_9c0,"{\n");
  Application::offset_abi_cxx11_(&local_578,&this->super_Application,3);
  std::operator+(&local_980,&local_9a0,&local_578);
  std::operator+(&local_960,&local_980,"conditionStr[rel].pop_back();\n");
  Application::offset_abi_cxx11_(&local_598,&this->super_Application,3);
  std::operator+(&local_940,&local_960,&local_598);
  std::operator+(&local_920,&local_940,"conditionStr[rel].pop_back();\n");
  Application::offset_abi_cxx11_(&local_5b8,&this->super_Application,3);
  std::operator+(&local_900,&local_920,&local_5b8);
  std::operator+(&local_8e0,&local_900,"ofs << \"double f_\"+relationName[rel]+\"(\"+");
  std::operator+(&local_8c0,&local_8e0,"variableList[rel]+\")\\n");
  std::operator+(&local_8a0,&local_8c0,
                 "{\\n\treturn (\"+conditionStr[rel]+\" ? 1.0 : 0.0);\\n}\\n\";\n");
  Application::offset_abi_cxx11_(&local_5d8,&this->super_Application,2);
  std::operator+(&local_880,&local_8a0,&local_5d8);
  std::operator+(&local_860,&local_880,"}\n");
  Application::offset_abi_cxx11_(&local_5f8,&this->super_Application,2);
  std::operator+(&local_840,&local_860,&local_5f8);
  std::operator+(&local_b60,&local_840,"else\n");
  Application::offset_abi_cxx11_(&local_618,&this->super_Application,2);
  std::operator+(&local_ba0,&local_b60,&local_618);
  std::operator+(&local_bc0,&local_ba0,"{\n");
  Application::offset_abi_cxx11_(&local_638,&this->super_Application,3);
  std::operator+(&local_c20,&local_bc0,&local_638);
  std::operator+(&local_c80,&local_c20,"ofs << \"double f_\"+relationName[rel]+");
  std::operator+(&local_c40,&local_c80,"\"(\"+variableList[rel]+\")\\n");
  std::operator+(&local_ca0,&local_c40,"{\\n\\treturn 1.0;\\n}\\n\";\n");
  Application::offset_abi_cxx11_(&local_658,&this->super_Application,2);
  std::operator+(&evalFunction,&local_ca0,&local_658);
  std::operator+(&findPrediction,&evalFunction,"}\n");
  Application::offset_abi_cxx11_(&local_678,&this->super_Application,1);
  std::operator+(&findPredSwitch,&findPrediction,&local_678);
  std::operator+(&loadFunction,&findPredSwitch,"}\n");
  Application::offset_abi_cxx11_(&local_698,&this->super_Application,1);
  std::operator+(&testTuple,&loadFunction,&local_698);
  std::operator+(&attrConstruct,&testTuple,"ofs << \"}\\n\";\n");
  Application::offset_abi_cxx11_(&local_6b8,&this->super_Application,1);
  std::operator+(&attributeString,&attrConstruct,&local_6b8);
  std::operator+(&genDynFuncs,&attributeString,"ofs.close();\n}\n");
  std::__cxx11::string::~string((string *)&attributeString);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&findPredSwitch);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&findPrediction);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_c20);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_b60);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string((string *)&local_b20);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::string((string *)&attributeString,"",(allocator *)&attrConstruct);
  Application::offset_abi_cxx11_(&testTuple,&this->super_Application,3);
  std::operator+(&attrConstruct,&testTuple,"qi::phrase_parse(tuple.begin(),tuple.end(),");
  std::__cxx11::string::~string((string *)&testTuple);
  uVar4 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= uVar4) break;
    pAVar2 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        uVar4);
    Application::offset_abi_cxx11_(&local_c40,&this->super_Application,4);
    std::operator+(&local_ca0,"\n",&local_c40);
    std::operator+(&evalFunction,&local_ca0,"qi::");
    Application::typeToStr_abi_cxx11_(&local_c80,&this->super_Application,pAVar2->_type);
    std::operator+(&findPrediction,&evalFunction,&local_c80);
    std::operator+(&findPredSwitch,&findPrediction,"_[phoenix::ref(");
    std::operator+(&loadFunction,&findPredSwitch,&pAVar2->_name);
    std::operator+(&testTuple,&loadFunction,") = qi::_1]>>");
    std::__cxx11::string::append((string *)&attrConstruct);
    std::__cxx11::string::~string((string *)&testTuple);
    std::__cxx11::string::~string((string *)&loadFunction);
    std::__cxx11::string::~string((string *)&findPredSwitch);
    std::__cxx11::string::~string((string *)&findPrediction);
    std::__cxx11::string::~string((string *)&local_c80);
    std::__cxx11::string::~string((string *)&evalFunction);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_c40);
    Application::offset_abi_cxx11_(&evalFunction,&this->super_Application,1);
    Application::typeToStr_abi_cxx11_(&local_ca0,&this->super_Application,pAVar2->_type);
    std::operator+(&findPrediction,&evalFunction,&local_ca0);
    std::operator+(&findPredSwitch,&findPrediction," ");
    std::operator+(&loadFunction,&findPredSwitch,&pAVar2->_name);
    std::operator+(&testTuple,&loadFunction,";\n");
    std::__cxx11::string::append((string *)&attributeString);
    std::__cxx11::string::~string((string *)&testTuple);
    std::__cxx11::string::~string((string *)&loadFunction);
    std::__cxx11::string::~string((string *)&findPredSwitch);
    std::__cxx11::string::~string((string *)&findPrediction);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&evalFunction);
    uVar4 = uVar4 + 1;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::pop_back();
  Application::offset_abi_cxx11_(&findPredSwitch,&this->super_Application,4);
  std::operator+(&loadFunction,",\n",&findPredSwitch);
  std::operator+(&testTuple,&loadFunction,"\'|\');\n");
  std::__cxx11::string::append((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&findPredSwitch);
  std::operator+(&local_c80,"\nstruct Test_tuple\n{\n",&attributeString);
  Application::offset_abi_cxx11_(&local_c20,&this->super_Application,1);
  std::operator+(&local_c40,&local_c80,&local_c20);
  std::operator+(&local_ca0,&local_c40,"Test_tuple(const std::string& tuple)\n");
  Application::offset_abi_cxx11_(&local_bc0,&this->super_Application,1);
  std::operator+(&evalFunction,&local_ca0,&local_bc0);
  std::operator+(&findPrediction,&evalFunction,"{\n");
  std::operator+(&findPredSwitch,&findPrediction,&attrConstruct);
  Application::offset_abi_cxx11_(&local_ba0,&this->super_Application,1);
  std::operator+(&loadFunction,&findPredSwitch,&local_ba0);
  std::operator+(&testTuple,&loadFunction,"}\n};\n\n");
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&findPredSwitch);
  std::__cxx11::string::~string((string *)&findPrediction);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_c20);
  std::__cxx11::string::~string((string *)&local_c80);
  Application::offset_abi_cxx11_(&local_9e0,&this->super_Application,1);
  std::operator+(&local_9c0,"void loadTestDataset(std::vector<Test_tuple>& TestDataset)\n{\n",
                 &local_9e0);
  std::operator+(&local_9a0,&local_9c0,"std::ifstream input;\n");
  Application::offset_abi_cxx11_(&local_a00,&this->super_Application,1);
  std::operator+(&local_980,&local_9a0,&local_a00);
  std::operator+(&local_960,&local_980,"std::string line;\n");
  Application::offset_abi_cxx11_(&local_a20,&this->super_Application,1);
  std::operator+(&local_940,&local_960,&local_a20);
  std::operator+(&local_920,&local_940,"input.open(\"");
  std::operator+(&local_900,&local_920,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::PATH_TO_DATA_abi_cxx11_);
  std::operator+(&local_8e0,&local_900,"/test_data.tbl\");\n");
  Application::offset_abi_cxx11_(&local_a40,&this->super_Application,1);
  std::operator+(&local_8c0,&local_8e0,&local_a40);
  std::operator+(&local_8a0,&local_8c0,"if (!input)\n");
  Application::offset_abi_cxx11_(&local_a60,&this->super_Application,1);
  std::operator+(&local_880,&local_8a0,&local_a60);
  std::operator+(&local_860,&local_880,"{\n");
  Application::offset_abi_cxx11_(&local_a80,&this->super_Application,2);
  std::operator+(&local_840,&local_860,&local_a80);
  std::operator+(&local_b60,&local_840,"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n");
  Application::offset_abi_cxx11_(&local_aa0,&this->super_Application,2);
  std::operator+(&local_ba0,&local_b60,&local_aa0);
  std::operator+(&local_bc0,&local_ba0,"exit(1);\n");
  Application::offset_abi_cxx11_(&local_ac0,&this->super_Application,1);
  std::operator+(&local_c20,&local_bc0,&local_ac0);
  std::operator+(&local_c80,&local_c20,"}\n");
  Application::offset_abi_cxx11_(&local_ae0,&this->super_Application,1);
  std::operator+(&local_c40,&local_c80,&local_ae0);
  std::operator+(&local_ca0,&local_c40,"while(getline(input, line))\n");
  Application::offset_abi_cxx11_(&local_b00,&this->super_Application,2);
  std::operator+(&evalFunction,&local_ca0,&local_b00);
  std::operator+(&findPrediction,&evalFunction,"TestDataset.push_back(Test_tuple(line));\n");
  Application::offset_abi_cxx11_(&local_b20,&this->super_Application,1);
  std::operator+(&findPredSwitch,&findPrediction,&local_b20);
  std::operator+(&loadFunction,&findPredSwitch,"input.close();\n}\n\n");
  std::__cxx11::string::~string((string *)&findPredSwitch);
  std::__cxx11::string::~string((string *)&local_b20);
  std::__cxx11::string::~string((string *)&findPrediction);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_c20);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_b60);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::string((string *)&findPredSwitch,"",(allocator *)&findPrediction);
  local_cc8 = 0;
  while( true ) {
    sVar1 = TreeDecomposition::numberOfAttributes
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar1 <= local_cc8) break;
    pAVar2 = TreeDecomposition::getAttribute
                       ((this->_td).
                        super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_cc8);
    Application::offset_abi_cxx11_(&local_ba0,&this->super_Application,3);
    std::operator+(&local_bc0,&local_ba0,"case ");
    std::__cxx11::to_string(&local_b60,local_cc8);
    std::operator+(&local_c20,&local_bc0,&local_b60);
    std::operator+(&local_c80,&local_c20," : ");
    std::operator+(&local_c40,&local_c80,"goLeft = (tuple.");
    std::operator+(&local_ca0,&local_c40,&pAVar2->_name);
    std::operator+(&evalFunction,&local_ca0,
                   condition +
                   (((this->_categoricalFeatures).super__Base_bitset<2UL>._M_w[local_cc8 >> 6] >>
                     (local_cc8 & 0x3f) & 1) != 0));
    std::operator+(&findPrediction,&evalFunction,"c.threshold); break;\n");
    std::__cxx11::string::append((string *)&findPredSwitch);
    std::__cxx11::string::~string((string *)&findPrediction);
    std::__cxx11::string::~string((string *)&evalFunction);
    std::__cxx11::string::~string((string *)&local_ca0);
    std::__cxx11::string::~string((string *)&local_c40);
    std::__cxx11::string::~string((string *)&local_c80);
    std::__cxx11::string::~string((string *)&local_c20);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_bc0);
    std::__cxx11::string::~string((string *)&local_ba0);
    local_cc8 = local_cc8 + 1;
  }
  Application::offset_abi_cxx11_(&local_a00,&this->super_Application,1);
  std::operator+(&local_9e0,
                 "double findPrediction(const RegTreeNode* node, const Test_tuple& tuple)\n{\n",
                 &local_a00);
  std::operator+(&local_9c0,&local_9e0,"if (node->isLeaf)\n");
  Application::offset_abi_cxx11_(&local_a20,&this->super_Application,2);
  std::operator+(&local_9a0,&local_9c0,&local_a20);
  std::operator+(&local_980,&local_9a0,"return node->prediction;\n\n");
  Application::offset_abi_cxx11_(&local_a40,&this->super_Application,1);
  std::operator+(&local_960,&local_980,&local_a40);
  std::operator+(&local_940,&local_960,"bool goLeft = true;\n");
  Application::offset_abi_cxx11_(&local_a60,&this->super_Application,1);
  std::operator+(&local_920,&local_940,&local_a60);
  std::operator+(&local_900,&local_920,"const Condition& c = node->condition;\n");
  Application::offset_abi_cxx11_(&local_a80,&this->super_Application,1);
  std::operator+(&local_8e0,&local_900,&local_a80);
  std::operator+(&local_8c0,&local_8e0,"switch (c.variable)\n");
  Application::offset_abi_cxx11_(&local_aa0,&this->super_Application,1);
  std::operator+(&local_8a0,&local_8c0,&local_aa0);
  std::operator+(&local_880,&local_8a0,"{\n");
  std::operator+(&local_860,&local_880,&findPredSwitch);
  Application::offset_abi_cxx11_(&local_ac0,&this->super_Application,1);
  std::operator+(&local_840,&local_860,&local_ac0);
  std::operator+(&local_b60,&local_840,"}\n");
  Application::offset_abi_cxx11_(&local_ae0,&this->super_Application,1);
  std::operator+(&local_ba0,&local_b60,&local_ae0);
  std::operator+(&local_bc0,&local_ba0,"if (goLeft)\n");
  Application::offset_abi_cxx11_(&local_b00,&this->super_Application,2);
  std::operator+(&local_c20,&local_bc0,&local_b00);
  std::operator+(&local_c80,&local_c20,"return findPrediction(node->lchild, tuple);\n");
  Application::offset_abi_cxx11_(&local_b20,&this->super_Application,1);
  std::operator+(&local_c40,&local_c80,&local_b20);
  std::operator+(&local_ca0,&local_c40,"else\n");
  Application::offset_abi_cxx11_(&local_7e0,&this->super_Application,2);
  std::operator+(&evalFunction,&local_ca0,&local_7e0);
  std::operator+(&findPrediction,&evalFunction,"return findPrediction(node->rchild, tuple);\n}\n\n")
  ;
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_b20);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_c20);
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_b60);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_a00);
  Application::offset_abi_cxx11_(&local_a40,&this->super_Application,1);
  std::operator+(&local_a20,"void evaluateModel(const RegTreeNode* root)\n{\n",&local_a40);
  std::operator+(&local_a00,&local_a20,"std::vector<Test_tuple> TestDataset;\n");
  Application::offset_abi_cxx11_(&local_a60,&this->super_Application,1);
  std::operator+(&local_9e0,&local_a00,&local_a60);
  std::operator+(&local_9c0,&local_9e0,"loadTestDataset(TestDataset);\n");
  Application::offset_abi_cxx11_(&local_a80,&this->super_Application,1);
  std::operator+(&local_9a0,&local_9c0,&local_a80);
  std::operator+(&local_980,&local_9a0,"double pred, diff, error = 0.0;\n");
  Application::offset_abi_cxx11_(&local_aa0,&this->super_Application,1);
  std::operator+(&local_960,&local_980,&local_aa0);
  std::operator+(&local_940,&local_960,"for (const Test_tuple& tuple : TestDataset)\n");
  Application::offset_abi_cxx11_(&local_ac0,&this->super_Application,2);
  std::operator+(&local_920,&local_940,&local_ac0);
  std::operator+(&local_900,&local_920,"{\n");
  Application::offset_abi_cxx11_(&local_ae0,&this->super_Application,2);
  std::operator+(&local_8e0,&local_900,&local_ae0);
  std::operator+(&local_8c0,&local_8e0,"pred = findPrediction(root, tuple);\n");
  Application::offset_abi_cxx11_(&local_b00,&this->super_Application,2);
  std::operator+(&local_8a0,&local_8c0,&local_b00);
  std::operator+(&local_880,&local_8a0,"diff = tuple.");
  pAVar2 = TreeDecomposition::getAttribute
                     ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,(long)this->_labelID);
  std::operator+(&local_860,&local_880,&pAVar2->_name);
  std::operator+(&local_840,&local_860,"-pred;\n");
  Application::offset_abi_cxx11_(&local_b20,&this->super_Application,2);
  std::operator+(&local_b60,&local_840,&local_b20);
  std::operator+(&local_ba0,&local_b60,"error += diff * diff;\n");
  Application::offset_abi_cxx11_(&local_7e0,&this->super_Application,1);
  std::operator+(&local_bc0,&local_ba0,&local_7e0);
  std::operator+(&local_c20,&local_bc0,"}\n");
  Application::offset_abi_cxx11_(&local_718,&this->super_Application,1);
  std::operator+(&local_c80,&local_c20,&local_718);
  std::operator+(&local_c40,&local_c80,"error /= TestDataset.size();\n");
  Application::offset_abi_cxx11_(&local_738,&this->super_Application,1);
  std::operator+(&local_ca0,&local_c40,&local_738);
  std::operator+(&evalFunction,&local_ca0,
                 "std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n}\n\n");
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string((string *)&local_c20);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_ba0);
  std::__cxx11::string::~string((string *)&local_b60);
  std::__cxx11::string::~string((string *)&local_b20);
  std::__cxx11::string::~string((string *)&local_840);
  std::__cxx11::string::~string((string *)&local_860);
  std::__cxx11::string::~string((string *)&local_880);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::__cxx11::string::~string((string *)&local_ae0);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_920);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string((string *)&local_940);
  std::__cxx11::string::~string((string *)&local_960);
  std::__cxx11::string::~string((string *)&local_aa0);
  std::__cxx11::string::~string((string *)&local_980);
  std::__cxx11::string::~string((string *)&local_9a0);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string((string *)&local_9c0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::~string((string *)&local_a60);
  std::__cxx11::string::~string((string *)&local_a00);
  std::__cxx11::string::~string((string *)&local_a20);
  std::__cxx11::string::~string((string *)&local_a40);
  std::operator+(&local_c20,&headerFiles,&testTuple);
  std::operator+(&local_c80,&local_c20,&loadFunction);
  std::operator+(&local_c40,&local_c80,&findPrediction);
  std::operator+(&local_ca0,&local_c40,&evalFunction);
  std::operator+(__return_storage_ptr__,&local_ca0,&genDynFuncs);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string((string *)&local_c20);
  std::__cxx11::string::~string((string *)&evalFunction);
  std::__cxx11::string::~string((string *)&findPrediction);
  std::__cxx11::string::~string((string *)&findPredSwitch);
  std::__cxx11::string::~string((string *)&loadFunction);
  std::__cxx11::string::~string((string *)&testTuple);
  std::__cxx11::string::~string((string *)&attrConstruct);
  std::__cxx11::string::~string((string *)&attributeString);
  std::__cxx11::string::~string((string *)&genDynFuncs);
  std::__cxx11::string::~string((string *)&headerFiles);
  std::__cxx11::string::~string((string *)&conditionsString);
  std::__cxx11::string::~string((string *)&varTypeList);
  std::__cxx11::string::~string((string *)&relationName);
  std::__cxx11::string::~string((string *)&relationMap);
  std::__cxx11::string::~string((string *)&varList);
  lVar5 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&condition[0]._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  return __return_storage_ptr__;
}

Assistant:

std::string RegressionTree::dynamicFunctionsGenerator()
{
    std::string condition[] = {" <= "," == "};
    
    std::string varList = "", relationMap = ""; 
    for (size_t var = 0; var< _td->numberOfAttributes(); ++var)
    {
        const std::string varName = _td->getAttribute(var)->_name;

	varList += "\""+varName+"\","; 
	relationMap += std::to_string(_queryRootIndex[var])+",";        
    }
    varList.pop_back();
    relationMap.pop_back();
    
    std::string relationName = "", varTypeList = "", conditionsString = ""; 
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {
	relationName += "\""+_td->getRelation(rel)->_name+"\",";
        conditionsString += "\"\",";

        varTypeList += "\"";

        var_bitset& bag = _td->getRelation(rel)->_bag;
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (bag[var])
            {
                Attribute* att = _td->getAttribute(var);
                varTypeList += typeToStr(att->_type)+" "+att->_name+",";
            }
        }
        varTypeList.pop_back();
        varTypeList += "\",";
    }
    relationName.pop_back();
    conditionsString.pop_back();
    varTypeList.pop_back();
    
    std::string headerFiles =offset(0)+
        "#include <fstream>\n"+
        "#include <vector>\n"+
        "#include \"RegressionTreeNode.hpp\"\n\n"+
        "#include <boost/spirit/include/qi.hpp>\n"+
        "#include <boost/spirit/include/phoenix_core.hpp>\n"+
        "#include <boost/spirit/include/phoenix_operator.hpp>\n\n"+
        "namespace qi = boost::spirit::qi;\n"+
        "namespace phoenix = boost::phoenix;\n\n";
    
    std::string genDynFuncs =
        "void generateDynamicFunctions(std::vector<Condition>& conditions)\n{\n"+
	offset(1)+"std::string variableMap[] = {"+varList+"};\n"+
	offset(1)+"std::string variableList[] = {"+varTypeList+"};\n"+
	offset(1)+"size_t relationMap[] = {"+relationMap+"};\n"+
	offset(1)+"std::string relationName[] = {"+relationName+"};\n"+
        offset(1)+"std::string conditionStr[] = {"+conditionsString+"};\n"+
        offset(1)+"for (Condition& c : conditions)\n"+
        offset(2)+"conditionStr[relationMap[c.variable]] += variableMap[c.variable] + "+
        "c.op + std::to_string(c.threshold) + \"&&\";\n"+
        offset(1)+"std::ofstream ofs(\"DynamicFunctions.cpp\", "+
        "std::ofstream::out);\n"+
        offset(1)+"ofs << \"#include \\\"DynamicFunctions.h\\\"\\n"+
        "namespace lmfao\\n{\\n\";\n"+
        offset(1)+"for (size_t rel = 0; rel < "+
        std::to_string(_td->numberOfRelations())+"; ++rel)\n"+offset(1)+"{\n"+
        offset(2)+"if (!conditionStr[rel].empty())\n"+offset(2)+"{\n"+
        offset(3)+"conditionStr[rel].pop_back();\n"+
        offset(3)+"conditionStr[rel].pop_back();\n"+
        offset(3)+"ofs << \"double f_\"+relationName[rel]+\"(\"+"+
        "variableList[rel]+\")\\n"+
        "{\\n\treturn (\"+conditionStr[rel]+\" ? 1.0 : 0.0);\\n}\\n\";\n"+
        offset(2)+"}\n"+offset(2)+"else\n"+offset(2)+"{\n"+
        offset(3)+"ofs << \"double f_\"+relationName[rel]+"+
        "\"(\"+variableList[rel]+\")\\n"+
        "{\\n\\treturn 1.0;\\n}\\n\";\n"+
        offset(2)+"}\n"+offset(1)+"}\n"+
        offset(1)+"ofs << \"}\\n\";\n"+offset(1)+"ofs.close();\n}\n";


    /********************************************************/
    /************ This is for loading Test Data *************/
    /********************************************************/
    
    // TODO: This should only output the features not all variables.
    // If changed it should be changed in the SQL generator as well.
    std::string attributeString = "",
        attrConstruct = offset(3)+"qi::phrase_parse(tuple.begin(),tuple.end(),";
        
    for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    {
        Attribute* att = _td->getAttribute(var);
        attrConstruct += "\n"+offset(4)+"qi::"+typeToStr(att->_type)+
            "_[phoenix::ref("+att->_name+") = qi::_1]>>";
        attributeString += offset(1)+typeToStr(att->_type) + " "+
            att->_name + ";\n";
    }

    // attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct.pop_back();
    attrConstruct += ",\n"+offset(4)+"\'|\');\n";

    std::string testTuple = "\nstruct Test_tuple\n{\n"+
        attributeString+offset(1)+"Test_tuple(const std::string& tuple)\n"+
        offset(1)+"{\n"+attrConstruct+offset(1)+"}\n};\n\n";

    std::string loadFunction =
        "void loadTestDataset(std::vector<Test_tuple>& TestDataset)\n{\n"+
        offset(1)+"std::ifstream input;\n"+offset(1)+"std::string line;\n"+
        offset(1)+"input.open(\""+PATH_TO_DATA+"/test_data.tbl\");\n"+
        offset(1)+"if (!input)\n"+offset(1)+"{\n"+
        offset(2)+"std::cerr << \"TestDataset.tbl does is not exist.\\n\";\n"+
        offset(2)+"exit(1);\n"+offset(1)+"}\n"+
        offset(1)+"while(getline(input, line))\n"+
        offset(2)+"TestDataset.push_back(Test_tuple(line));\n"+
        offset(1)+"input.close();\n}\n\n";
    

    /****************************************************************/
    /************ This is for finding prediction & eval *************/
    /****************************************************************/

    std::string findPredSwitch=""; 
    for (size_t var = 0; var< _td->numberOfAttributes(); ++var)
    {
        const std::string& varName = _td->getAttribute(var)->_name;
        findPredSwitch += offset(3)+"case "+std::to_string(var)+" : "+
            "goLeft = (tuple."+varName+condition[_categoricalFeatures[var]]+
            "c.threshold); break;\n";       
    }
    
    std::string findPrediction =
        "double findPrediction(const RegTreeNode* node, const Test_tuple& tuple)\n{\n"+
        offset(1)+"if (node->isLeaf)\n"+
        offset(2)+"return node->prediction;\n\n"+
        offset(1)+"bool goLeft = true;\n"+
        offset(1)+"const Condition& c = node->condition;\n"+
        offset(1)+"switch (c.variable)\n"+
        offset(1)+"{\n"+findPredSwitch+offset(1)+"}\n"+
        offset(1)+"if (goLeft)\n"+
        offset(2)+"return findPrediction(node->lchild, tuple);\n"+
        offset(1)+"else\n"+
        offset(2)+"return findPrediction(node->rchild, tuple);\n}\n\n";
    
    std::string evalFunction = "void evaluateModel(const RegTreeNode* root)\n{\n"+
        offset(1)+"std::vector<Test_tuple> TestDataset;\n"+
        offset(1)+"loadTestDataset(TestDataset);\n"+
        offset(1)+"double pred, diff, error = 0.0;\n"+
        offset(1)+"for (const Test_tuple& tuple : TestDataset)\n"+offset(2)+"{\n"+
        offset(2)+"pred = findPrediction(root, tuple);\n"+
        offset(2)+"diff = tuple."+_td->getAttribute(_labelID)->_name+"-pred;\n"+
        offset(2)+"error += diff * diff;\n"+
        offset(1)+"}\n"+
        offset(1)+"error /= TestDataset.size();\n"+
        offset(1)+"std::cout << \"RMSE: \" << sqrt(error) << std::endl;\n}\n\n";
    
    return headerFiles+testTuple+loadFunction+findPrediction+evalFunction+genDynFuncs;
}